

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

ImFont * __thiscall ImFontAtlas::AddFont(ImFontAtlas *this,ImFontConfig *font_cfg)

{
  undefined2 uVar1;
  ImFont **__src;
  int iVar2;
  ImFontConfig *font_cfg_1;
  ImFont *pIVar3;
  ImFont **__dest;
  ImFontConfig *pIVar4;
  void *__dest_00;
  ImFontConfig *pIVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  short sVar9;
  
  if (font_cfg->MergeMode == false) {
    pIVar3 = (ImFont *)ImGui::MemAlloc(0x78);
    (pIVar3->IndexAdvanceX).Size = 0;
    (pIVar3->IndexAdvanceX).Capacity = 0;
    (pIVar3->IndexAdvanceX).Data = (float *)0x0;
    pIVar3->FallbackAdvanceX = 0.0;
    pIVar3->FontSize = 0.0;
    (pIVar3->IndexLookup).Size = 0;
    (pIVar3->IndexLookup).Capacity = 0;
    (pIVar3->IndexLookup).Data = (unsigned_short *)0x0;
    (pIVar3->Glyphs).Size = 0;
    (pIVar3->Glyphs).Capacity = 0;
    (pIVar3->Glyphs).Data = (ImFontGlyph *)0x0;
    pIVar3->FallbackChar = 0xffff;
    pIVar3->EllipsisChar = 0xffff;
    pIVar3->FallbackGlyph = (ImFontGlyph *)0x0;
    pIVar3->ContainerAtlas = (ImFontAtlas *)0x0;
    *(undefined8 *)((long)&pIVar3->ContainerAtlas + 2) = 0;
    *(undefined8 *)((long)&pIVar3->ConfigData + 2) = 0;
    *(undefined8 *)&pIVar3->EllipsisCharCount = 0;
    *(undefined4 *)((long)&pIVar3->EllipsisCharStep + 1) = 0;
    pIVar3->Scale = 1.0;
    pIVar3->Ascent = 0.0;
    pIVar3->Descent = 0.0;
    *(undefined8 *)((long)&pIVar3->Descent + 2) = 0;
    iVar2 = (this->Fonts).Size;
    if (iVar2 == (this->Fonts).Capacity) {
      if (iVar2 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar2 / 2 + iVar2;
      }
      iVar8 = iVar2 + 1;
      if (iVar2 + 1 < iVar6) {
        iVar8 = iVar6;
      }
      __dest = (ImFont **)ImGui::MemAlloc((long)iVar8 << 3);
      __src = (this->Fonts).Data;
      if (__src != (ImFont **)0x0) {
        memcpy(__dest,__src,(long)(this->Fonts).Size << 3);
        ImGui::MemFree((this->Fonts).Data);
      }
      (this->Fonts).Data = __dest;
      (this->Fonts).Capacity = iVar8;
      iVar2 = (this->Fonts).Size;
    }
    else {
      __dest = (this->Fonts).Data;
    }
    __dest[iVar2] = pIVar3;
    (this->Fonts).Size = (this->Fonts).Size + 1;
  }
  iVar2 = (this->ConfigData).Size;
  if (iVar2 == (this->ConfigData).Capacity) {
    if (iVar2 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar2 / 2 + iVar2;
    }
    iVar8 = iVar2 + 1;
    if (iVar2 + 1 < iVar6) {
      iVar8 = iVar6;
    }
    pIVar4 = (ImFontConfig *)ImGui::MemAlloc((long)iVar8 * 0x90);
    pIVar5 = (this->ConfigData).Data;
    if (pIVar5 != (ImFontConfig *)0x0) {
      memcpy(pIVar4,pIVar5,(long)(this->ConfigData).Size * 0x90);
      ImGui::MemFree((this->ConfigData).Data);
    }
    (this->ConfigData).Data = pIVar4;
    (this->ConfigData).Capacity = iVar8;
    iVar2 = (this->ConfigData).Size;
  }
  else {
    pIVar4 = (this->ConfigData).Data;
  }
  memcpy(pIVar4 + iVar2,font_cfg,0x90);
  iVar2 = (this->ConfigData).Size;
  (this->ConfigData).Size = iVar2 + 1;
  pIVar4 = (this->ConfigData).Data;
  pIVar3 = pIVar4[iVar2].DstFont;
  if (pIVar3 == (ImFont *)0x0) {
    pIVar3 = (this->Fonts).Data[(long)(this->Fonts).Size + -1];
    pIVar4[iVar2].DstFont = pIVar3;
  }
  if (pIVar4[iVar2].FontDataOwnedByAtlas == false) {
    __dest_00 = ImGui::MemAlloc((long)pIVar4[iVar2].FontDataSize);
    pIVar4[iVar2].FontData = __dest_00;
    pIVar4[iVar2].FontDataOwnedByAtlas = true;
    memcpy(__dest_00,font_cfg->FontData,(long)pIVar4[iVar2].FontDataSize);
    pIVar3 = pIVar4[iVar2].DstFont;
  }
  if (pIVar3->EllipsisChar == 0xffff) {
    pIVar3->EllipsisChar = font_cfg->EllipsisChar;
  }
  lVar7 = (long)(this->ConfigData).Size;
  if (lVar7 != 0) {
    pIVar5 = (this->ConfigData).Data;
    lVar7 = lVar7 * 0x90;
    do {
      pIVar3 = pIVar5->DstFont;
      if (pIVar5->MergeMode == true) {
        uVar1 = pIVar3->ConfigDataCount;
        sVar9 = uVar1 + 1;
      }
      else {
        pIVar3->ConfigData = pIVar5;
        sVar9 = 1;
      }
      pIVar3->ConfigDataCount = sVar9;
      pIVar5 = pIVar5 + 1;
      lVar7 = lVar7 + -0x90;
    } while (lVar7 != 0);
  }
  this->TexReady = false;
  ClearTexData(this);
  return pIVar4[iVar2].DstFont;
}

Assistant:

ImFont* ImFontAtlas::AddFont(const ImFontConfig* font_cfg)
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    IM_ASSERT(font_cfg->FontData != NULL && font_cfg->FontDataSize > 0);
    IM_ASSERT(font_cfg->SizePixels > 0.0f);

    // Create new font
    if (!font_cfg->MergeMode)
        Fonts.push_back(IM_NEW(ImFont));
    else
        IM_ASSERT(!Fonts.empty() && "Cannot use MergeMode for the first font"); // When using MergeMode make sure that a font has already been added before. You can use ImGui::GetIO().Fonts->AddFontDefault() to add the default imgui font.

    ConfigData.push_back(*font_cfg);
    ImFontConfig& new_font_cfg = ConfigData.back();
    if (new_font_cfg.DstFont == NULL)
        new_font_cfg.DstFont = Fonts.back();
    if (!new_font_cfg.FontDataOwnedByAtlas)
    {
        new_font_cfg.FontData = IM_ALLOC(new_font_cfg.FontDataSize);
        new_font_cfg.FontDataOwnedByAtlas = true;
        memcpy(new_font_cfg.FontData, font_cfg->FontData, (size_t)new_font_cfg.FontDataSize);
    }

    if (new_font_cfg.DstFont->EllipsisChar == (ImWchar)-1)
        new_font_cfg.DstFont->EllipsisChar = font_cfg->EllipsisChar;

    ImFontAtlasUpdateConfigDataPointers(this);

    // Invalidate texture
    TexReady = false;
    ClearTexData();
    return new_font_cfg.DstFont;
}